

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O3

int __thiscall
pstore::sstring_view<const_char_*>::compare<char[1]>(sstring_view<const_char_*> *this,char (*s) [1])

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar2 = strlen(*s);
  uVar1 = this->size_;
  uVar4 = uVar1;
  if (sVar2 < uVar1) {
    uVar4 = sVar2;
  }
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      if (this->ptr_[uVar5] < s[uVar5][0]) {
        return -1;
      }
      if (s[uVar5][0] < this->ptr_[uVar5]) {
        return 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  uVar3 = 0;
  if (uVar1 != sVar2) {
    uVar3 = -(uint)(uVar1 < sVar2) | 1;
  }
  return uVar3;
}

Assistant:

int sstring_view<PointerType>::compare (StringType const & s) const {
        auto const slen = string_traits<StringType>::length (s);
        size_type const common_len = std::min (size (), slen);
        int result = traits::compare (data (), string_traits<StringType>::data (s), common_len);
        if (result == 0) {
            result = (size () == slen) ? 0 : (size () < slen ? -1 : 1);
        }
        return result;
    }